

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_row,int len)

{
  int *piVar1;
  Dring *pDVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  pointer pnVar5;
  type_conflict5 tVar6;
  int iVar7;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<100U,_int,_void> *this_00;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  long local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if ((U *)(this->u).row.elem[p_row].next == &this->u) {
    iVar11 = len - (this->u).row.max[p_row];
    iVar7 = (this->u).row.used;
    if ((this->u).row.size - iVar7 < iVar11) {
      packRows(this);
      iVar11 = len - (this->u).row.max[p_row];
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_d8.data._M_elems._0_8_ = SEXT48((this->u).row.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                (&local_88,&(this->rowMemMult).m_backend,(longlong *)&local_d8);
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 0x10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems[6] = 0;
      local_d8.data._M_elems[7] = 0;
      local_d8.data._M_elems[0xc] = 0;
      local_d8.data._M_elems[0xd] = 0;
      local_d8.data._M_elems._56_5_ = 0;
      local_d8.data._M_elems[0xf]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      local_d8.data._M_elems[8] = 0;
      local_d8.data._M_elems[9] = 0;
      local_d8.data._M_elems[10] = 0;
      local_d8.data._M_elems[0xb] = 0;
      local_e0 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                (&local_d8,&local_88,&local_e0);
      tVar6 = boost::multiprecision::operator<
                        (&(this->u).row.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d8);
      iVar7 = (this->u).row.used;
      if (tVar6) {
        minRowMem(this,len + iVar7 * 2);
        iVar7 = (this->u).row.used;
      }
    }
    (this->u).row.used = iVar7 + iVar11;
    (this->u).row.max[p_row] = len;
  }
  else {
    iVar7 = (this->u).row.used;
    if ((this->u).row.size - iVar7 < len) {
      packRows(this);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_d8.data._M_elems._0_8_ = SEXT48((this->u).row.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                (&local_88,&(this->rowMemMult).m_backend,(longlong *)&local_d8);
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 0x10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems[6] = 0;
      local_d8.data._M_elems[7] = 0;
      local_d8.data._M_elems[0xc] = 0;
      local_d8.data._M_elems[0xd] = 0;
      local_d8.data._M_elems._56_5_ = 0;
      local_d8.data._M_elems[0xf]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      local_d8.data._M_elems[8] = 0;
      local_d8.data._M_elems[9] = 0;
      local_d8.data._M_elems[10] = 0;
      local_d8.data._M_elems[0xb] = 0;
      local_e0 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                (&local_d8,&local_88,&local_e0);
      tVar6 = boost::multiprecision::operator<
                        (&(this->u).row.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d8);
      iVar7 = (this->u).row.used;
      if (tVar6) {
        minRowMem(this,len + iVar7 * 2);
        iVar7 = (this->u).row.used;
      }
    }
    piVar1 = (this->u).row.start;
    lVar9 = (long)piVar1[p_row];
    iVar11 = (this->u).row.len[p_row];
    piVar1[p_row] = iVar7;
    piVar1 = &(this->u).row.used;
    *piVar1 = *piVar1 + len;
    lVar10 = iVar11 + lVar9;
    pDVar2 = (this->u).row.elem;
    piVar1 = (this->u).row.max;
    pDVar3 = pDVar2[p_row].prev;
    piVar1[pDVar3->idx] = piVar1[pDVar3->idx] + piVar1[p_row];
    piVar1[p_row] = len;
    pDVar4 = pDVar2[p_row].next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).row.list.prev;
    pDVar4 = pDVar3->next;
    pDVar2[p_row].next = pDVar4;
    pDVar4->prev = pDVar2 + p_row;
    pDVar2[p_row].prev = pDVar3;
    pDVar3->next = pDVar2 + p_row;
    pnVar5 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar1 = (this->u).row.idx;
    lVar8 = (long)iVar7;
    v = &pnVar5[lVar9].m_backend;
    this_00 = &pnVar5[lVar8].m_backend;
    for (; lVar9 < lVar10; lVar9 = lVar9 + 1) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,v);
      piVar1[lVar8] = piVar1[lVar9];
      lVar8 = lVar8 + 1;
      v = v + 1;
      this_00 = this_00 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.size - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.row.size - u.row.used)
      {
         packRows();

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      idx = u.row.idx;
      val = u.row.val.data();

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}